

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void embree::SceneGraph::extend_animation
               (Ref<embree::SceneGraph::Node> *node0,Ref<embree::SceneGraph::Node> *node1)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  size_t sVar6;
  size_t sVar7;
  runtime_error *prVar8;
  Ref<embree::SceneGraph::Node> *in_RSI;
  long *in_RDI;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p_4;
  iterator __end9;
  iterator __begin9;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *__range9;
  Ref<embree::SceneGraph::SubdivMeshNode> mesh1_4;
  Ref<embree::SceneGraph::SubdivMeshNode> mesh0_4;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *p_3;
  iterator __end8;
  iterator __begin8;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *__range8;
  Ref<embree::SceneGraph::PointSetNode> mesh1_3;
  Ref<embree::SceneGraph::PointSetNode> mesh0_3;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *p_2;
  iterator __end7;
  iterator __begin7;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *__range7;
  Ref<embree::SceneGraph::HairSetNode> mesh1_2;
  Ref<embree::SceneGraph::HairSetNode> mesh0_2;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p_1;
  iterator __end6;
  iterator __begin6;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *__range6;
  Ref<embree::SceneGraph::QuadMeshNode> mesh1_1;
  Ref<embree::SceneGraph::QuadMeshNode> mesh0_1;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p;
  iterator __end5;
  iterator __begin5;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *__range5;
  Ref<embree::SceneGraph::TriangleMeshNode> mesh1;
  Ref<embree::SceneGraph::TriangleMeshNode> mesh0;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> groupNode1;
  Ref<embree::SceneGraph::GroupNode> groupNode0;
  Ref<embree::SceneGraph::TransformNode> xfmNode1;
  Ref<embree::SceneGraph::TransformNode> xfmNode0;
  SubdivMeshNode *in_stack_fffffffffffff518;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffff520;
  Transformations *in_stack_fffffffffffff540;
  Transformations *in_stack_fffffffffffff548;
  long *local_9e8;
  long *local_9c8;
  long *local_958;
  long *local_938;
  long *local_8c8;
  long *local_8a8;
  long *local_838;
  long *local_818;
  long *local_7a8;
  long *local_788;
  long *local_6e0;
  long *local_6c0;
  long *local_630;
  Ref<embree::SceneGraph::Node> *local_610;
  __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
  local_5e0;
  long *local_5d8;
  long *local_5d0;
  long *local_5c8;
  reference local_5c0;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *local_5b8;
  __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
  local_5b0;
  long *local_5a8;
  long *local_5a0;
  long *local_598;
  reference local_590;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *local_588;
  __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
  local_580;
  long *local_578;
  long *local_570;
  long *local_568;
  reference local_560;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *local_558;
  __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
  local_550;
  long *local_548;
  long *local_540;
  long *local_538;
  reference local_530;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *local_528;
  __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
  local_520;
  long *local_518;
  long *local_510;
  long *local_508;
  Node *local_500;
  Node *local_4f8;
  ulong local_4f0;
  long *local_4e8;
  long *local_4e0;
  long *local_4d8;
  Node *local_4d0;
  long *local_4c8;
  Ref<embree::SceneGraph::Node> *pRVar9;
  
  if ((Node *)*in_RDI != in_RSI->ptr) {
    pRVar9 = in_RSI;
    if (*in_RDI == 0) {
      local_610 = (Ref<embree::SceneGraph::Node> *)0x0;
    }
    else {
      local_610 = (Ref<embree::SceneGraph::Node> *)
                  __dynamic_cast(*in_RDI,&Node::typeinfo,&TransformNode::typeinfo,0);
    }
    if (local_610 != (Ref<embree::SceneGraph::Node> *)0x0) {
      (**(code **)&local_610->ptr->fileName)();
    }
    if (local_610 == (Ref<embree::SceneGraph::Node> *)0x0) {
      if (*in_RDI == 0) {
        local_6c0 = (long *)0x0;
      }
      else {
        local_6c0 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      local_4e0 = local_6c0;
      if (local_6c0 != (long *)0x0) {
        (**(code **)(*local_6c0 + 0x10))();
      }
      if (local_4e0 == (long *)0x0) {
        if (*in_RDI == 0) {
          local_788 = (long *)0x0;
        }
        else {
          local_788 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
        }
        local_508 = local_788;
        if (local_788 != (long *)0x0) {
          (**(code **)(*local_788 + 0x10))();
        }
        if (local_508 == (long *)0x0) {
          if (*in_RDI == 0) {
            local_818 = (long *)0x0;
          }
          else {
            local_818 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          }
          local_538 = local_818;
          if (local_818 != (long *)0x0) {
            (**(code **)(*local_818 + 0x10))();
          }
          if (local_538 == (long *)0x0) {
            if (*in_RDI == 0) {
              local_8a8 = (long *)0x0;
            }
            else {
              local_8a8 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&HairSetNode::typeinfo,0);
            }
            local_568 = local_8a8;
            if (local_8a8 != (long *)0x0) {
              (**(code **)(*local_8a8 + 0x10))();
            }
            if (local_568 == (long *)0x0) {
              if (*in_RDI == 0) {
                local_938 = (long *)0x0;
              }
              else {
                local_938 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&PointSetNode::typeinfo,0
                                                  );
              }
              local_598 = local_938;
              if (local_938 != (long *)0x0) {
                (**(code **)(*local_938 + 0x10))();
              }
              if (local_598 == (long *)0x0) {
                if (*in_RDI == 0) {
                  local_9c8 = (long *)0x0;
                }
                else {
                  local_9c8 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,
                                                     &SubdivMeshNode::typeinfo,0);
                }
                local_5c8 = local_9c8;
                if (local_9c8 != (long *)0x0) {
                  (**(code **)(*local_9c8 + 0x10))();
                }
                if (local_5c8 != (long *)0x0) {
                  if (in_RSI->ptr == (Node *)0x0) {
                    local_9e8 = (long *)0x0;
                  }
                  else {
                    local_9e8 = (long *)__dynamic_cast(in_RSI->ptr,&Node::typeinfo,
                                                       &SubdivMeshNode::typeinfo,0);
                  }
                  local_5d0 = local_9e8;
                  if (local_9e8 != (long *)0x0) {
                    (**(code **)(*local_9e8 + 0x10))();
                  }
                  if (local_5d0 == (long *)0x0) {
                    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar8,"incompatible scene graph");
                    __cxa_throw(prVar8,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  sVar6 = SubdivMeshNode::numPositions(in_stack_fffffffffffff518);
                  sVar7 = SubdivMeshNode::numPositions(in_stack_fffffffffffff518);
                  if (sVar6 != sVar7) {
                    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar8,"incompatible scene graph");
                    __cxa_throw(prVar8,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  bVar2 = std::operator!=((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                          in_stack_fffffffffffff520,
                                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                          in_stack_fffffffffffff518);
                  if (bVar2) {
                    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar8,"incompatible scene graph");
                    __cxa_throw(prVar8,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  local_5d8 = local_5d0 + 0xe;
                  local_5e0._M_current =
                       (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *
                       )std::
                        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        ::begin((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                 *)in_stack_fffffffffffff518);
                  std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::end((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         *)in_stack_fffffffffffff518);
                  while (bVar2 = __gnu_cxx::operator!=
                                           ((__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                                             *)in_stack_fffffffffffff520,
                                            (__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                                             *)in_stack_fffffffffffff518), bVar2) {
                    __gnu_cxx::
                    __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                    ::operator*(&local_5e0);
                    std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::push_back(in_stack_fffffffffffff520,(value_type *)in_stack_fffffffffffff518);
                    __gnu_cxx::
                    __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                    ::operator++(&local_5e0);
                  }
                  if (local_5d0 != (long *)0x0) {
                    (**(code **)(*local_5d0 + 0x18))();
                  }
                }
                if (local_5c8 != (long *)0x0) {
                  (**(code **)(*local_5c8 + 0x18))();
                }
              }
              else {
                if (in_RSI->ptr == (Node *)0x0) {
                  local_958 = (long *)0x0;
                }
                else {
                  local_958 = (long *)__dynamic_cast(in_RSI->ptr,&Node::typeinfo,
                                                     &PointSetNode::typeinfo,0);
                }
                local_5a0 = local_958;
                if (local_958 != (long *)0x0) {
                  (**(code **)(*local_958 + 0x10))();
                }
                if (local_5a0 == (long *)0x0) {
                  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar8,"incompatible scene graph");
                  __cxa_throw(prVar8,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                sVar6 = PointSetNode::numVertices((PointSetNode *)in_stack_fffffffffffff518);
                sVar7 = PointSetNode::numVertices((PointSetNode *)in_stack_fffffffffffff518);
                if (sVar6 != sVar7) {
                  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar8,"incompatible scene graph");
                  __cxa_throw(prVar8,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                local_5a8 = local_5a0 + 0xf;
                local_5b0._M_current =
                     (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                     std::
                     vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                     ::begin((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                              *)in_stack_fffffffffffff518);
                local_5b8 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
                             *)std::
                               vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                               ::end((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                      *)in_stack_fffffffffffff518);
                while (bVar2 = __gnu_cxx::operator!=
                                         ((__normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                                           *)in_stack_fffffffffffff520,
                                          (__normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                                           *)in_stack_fffffffffffff518), bVar2) {
                  local_5c0 = __gnu_cxx::
                              __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                              ::operator*(&local_5b0);
                  std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                               *)in_stack_fffffffffffff520,(value_type *)in_stack_fffffffffffff518);
                  __gnu_cxx::
                  __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                  ::operator++(&local_5b0);
                }
                if (local_5a0 != (long *)0x0) {
                  (**(code **)(*local_5a0 + 0x18))();
                }
              }
              if (local_598 != (long *)0x0) {
                (**(code **)(*local_598 + 0x18))();
              }
            }
            else {
              if (in_RSI->ptr == (Node *)0x0) {
                local_8c8 = (long *)0x0;
              }
              else {
                local_8c8 = (long *)__dynamic_cast(in_RSI->ptr,&Node::typeinfo,
                                                   &HairSetNode::typeinfo,0);
              }
              local_570 = local_8c8;
              if (local_8c8 != (long *)0x0) {
                (**(code **)(*local_8c8 + 0x10))();
              }
              if (local_570 == (long *)0x0) {
                prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar8,"incompatible scene graph");
                __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              sVar6 = HairSetNode::numVertices((HairSetNode *)in_stack_fffffffffffff518);
              sVar7 = HairSetNode::numVertices((HairSetNode *)in_stack_fffffffffffff518);
              if (sVar6 != sVar7) {
                prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar8,"incompatible scene graph");
                __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              local_578 = local_570 + 0xf;
              local_580._M_current =
                   (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                   std::
                   vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ::begin((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                            *)in_stack_fffffffffffff518);
              local_588 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
                           *)std::
                             vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                             ::end((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                    *)in_stack_fffffffffffff518);
              while (bVar2 = __gnu_cxx::operator!=
                                       ((__normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                                         *)in_stack_fffffffffffff520,
                                        (__normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                                         *)in_stack_fffffffffffff518), bVar2) {
                local_590 = __gnu_cxx::
                            __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                            ::operator*(&local_580);
                std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                             *)in_stack_fffffffffffff520,(value_type *)in_stack_fffffffffffff518);
                __gnu_cxx::
                __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                ::operator++(&local_580);
              }
              if (local_570 != (long *)0x0) {
                (**(code **)(*local_570 + 0x18))();
              }
            }
            if (local_568 != (long *)0x0) {
              (**(code **)(*local_568 + 0x18))();
            }
          }
          else {
            if (in_RSI->ptr == (Node *)0x0) {
              local_838 = (long *)0x0;
            }
            else {
              local_838 = (long *)__dynamic_cast(in_RSI->ptr,&Node::typeinfo,&QuadMeshNode::typeinfo
                                                 ,0);
            }
            local_540 = local_838;
            if (local_838 != (long *)0x0) {
              (**(code **)(*local_838 + 0x10))();
            }
            if (local_540 == (long *)0x0) {
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar8,"incompatible scene graph");
              __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            sVar6 = QuadMeshNode::numVertices((QuadMeshNode *)in_stack_fffffffffffff518);
            sVar7 = QuadMeshNode::numVertices((QuadMeshNode *)in_stack_fffffffffffff518);
            if (sVar6 != sVar7) {
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar8,"incompatible scene graph");
              __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            local_548 = local_540 + 0xe;
            local_550._M_current =
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 std::
                 vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 ::begin((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                          *)in_stack_fffffffffffff518);
            local_558 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                         *)std::
                           vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           ::end((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                  *)in_stack_fffffffffffff518);
            while (bVar2 = __gnu_cxx::operator!=
                                     ((__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                                       *)in_stack_fffffffffffff520,
                                      (__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                                       *)in_stack_fffffffffffff518), bVar2) {
              local_560 = __gnu_cxx::
                          __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                          ::operator*(&local_550);
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::push_back(in_stack_fffffffffffff520,(value_type *)in_stack_fffffffffffff518);
              __gnu_cxx::
              __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
              ::operator++(&local_550);
            }
            if (local_540 != (long *)0x0) {
              (**(code **)(*local_540 + 0x18))();
            }
          }
          if (local_538 != (long *)0x0) {
            (**(code **)(*local_538 + 0x18))();
          }
        }
        else {
          if (in_RSI->ptr == (Node *)0x0) {
            local_7a8 = (long *)0x0;
          }
          else {
            local_7a8 = (long *)__dynamic_cast(in_RSI->ptr,&Node::typeinfo,
                                               &TriangleMeshNode::typeinfo,0);
          }
          local_510 = local_7a8;
          if (local_7a8 != (long *)0x0) {
            (**(code **)(*local_7a8 + 0x10))();
          }
          if (local_510 == (long *)0x0) {
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar8,"incompatible scene graph");
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          sVar6 = TriangleMeshNode::numVertices((TriangleMeshNode *)in_stack_fffffffffffff518);
          sVar7 = TriangleMeshNode::numVertices((TriangleMeshNode *)in_stack_fffffffffffff518);
          if (sVar6 != sVar7) {
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar8,"incompatible scene graph");
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          local_518 = local_510 + 0xe;
          local_520._M_current =
               (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
               std::
               vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ::begin((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        *)in_stack_fffffffffffff518);
          local_528 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                      std::
                      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ::end((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                             *)in_stack_fffffffffffff518);
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                                     *)in_stack_fffffffffffff520,
                                    (__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                                     *)in_stack_fffffffffffff518), bVar2) {
            local_530 = __gnu_cxx::
                        __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                        ::operator*(&local_520);
            std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::push_back(in_stack_fffffffffffff520,(value_type *)in_stack_fffffffffffff518);
            __gnu_cxx::
            __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
            ::operator++(&local_520);
          }
          if (local_510 != (long *)0x0) {
            (**(code **)(*local_510 + 0x18))();
          }
        }
        if (local_508 != (long *)0x0) {
          (**(code **)(*local_508 + 0x18))();
        }
      }
      else {
        if (in_RSI->ptr == (Node *)0x0) {
          local_6e0 = (long *)0x0;
        }
        else {
          local_6e0 = (long *)__dynamic_cast(in_RSI->ptr,&Node::typeinfo,&GroupNode::typeinfo,0);
        }
        local_4e8 = local_6e0;
        if (local_6e0 != (long *)0x0) {
          (**(code **)(*local_6e0 + 0x10))();
        }
        if (local_4e8 == (long *)0x0) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar8,"incompatible scene graph");
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sVar3 = std::
                vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                        *)(local_4e0 + 0xd));
        sVar4 = std::
                vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                        *)(local_4e8 + 0xd));
        if (sVar3 != sVar4) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar8,"incompatible scene graph");
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        for (local_4f0 = 0; uVar1 = local_4f0,
            sVar3 = std::
                    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                    ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                            *)(local_4e0 + 0xd)), uVar1 < sVar3; local_4f0 = local_4f0 + 1) {
          pvVar5 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_4e0 + 0xd),local_4f0);
          local_4f8 = pvVar5->ptr;
          if (local_4f8 != (Node *)0x0) {
            (*(local_4f8->super_RefCount)._vptr_RefCount[2])();
          }
          pvVar5 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_4e8 + 0xd),local_4f0);
          local_500 = pvVar5->ptr;
          if (local_500 != (Node *)0x0) {
            (*(local_500->super_RefCount)._vptr_RefCount[2])();
          }
          extend_animation(pRVar9,local_610);
          if (local_500 != (Node *)0x0) {
            (*(local_500->super_RefCount)._vptr_RefCount[3])();
          }
          if (local_4f8 != (Node *)0x0) {
            (*(local_4f8->super_RefCount)._vptr_RefCount[3])();
          }
        }
        if (local_4e8 != (long *)0x0) {
          (**(code **)(*local_4e8 + 0x18))();
        }
      }
      if (local_4e0 != (long *)0x0) {
        (**(code **)(*local_4e0 + 0x18))();
      }
    }
    else {
      if (in_RSI->ptr == (Node *)0x0) {
        local_630 = (long *)0x0;
      }
      else {
        local_630 = (long *)__dynamic_cast(in_RSI->ptr,&Node::typeinfo,&TransformNode::typeinfo,0);
      }
      local_4c8 = local_630;
      if (local_630 != (long *)0x0) {
        (**(code **)(*local_630 + 0x10))();
      }
      if (local_4c8 == (long *)0x0) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"incompatible scene graph");
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      Transformations::add(in_stack_fffffffffffff548,in_stack_fffffffffffff540);
      local_4d0 = local_610[0x13].ptr;
      if (local_4d0 != (Node *)0x0) {
        (*(local_4d0->super_RefCount)._vptr_RefCount[2])();
      }
      local_4d8 = (long *)local_4c8[0x13];
      if (local_4d8 != (long *)0x0) {
        (**(code **)(*local_4d8 + 0x10))();
      }
      extend_animation(pRVar9,local_610);
      if (local_4d8 != (long *)0x0) {
        (**(code **)(*local_4d8 + 0x18))();
      }
      if (local_4d0 != (Node *)0x0) {
        (*(local_4d0->super_RefCount)._vptr_RefCount[3])();
      }
      if (local_4c8 != (long *)0x0) {
        (**(code **)(*local_4c8 + 0x18))();
      }
    }
    if (local_610 != (Ref<embree::SceneGraph::Node> *)0x0) {
      (*(code *)(local_610->ptr->fileName)._M_string_length)();
    }
  }
  return;
}

Assistant:

void SceneGraph::extend_animation(Ref<SceneGraph::Node> node0, Ref<SceneGraph::Node> node1)
  {
    if (node0 == node1) return;
      
    if (Ref<SceneGraph::TransformNode> xfmNode0 = node0.dynamicCast<SceneGraph::TransformNode>()) 
    {
      if (Ref<SceneGraph::TransformNode> xfmNode1 = node1.dynamicCast<SceneGraph::TransformNode>()) 
      {
        xfmNode0->spaces.add(xfmNode1->spaces);
        extend_animation(xfmNode0->child, xfmNode1->child);
      } 
      else THROW_RUNTIME_ERROR("incompatible scene graph"); 
    }
    else if (Ref<SceneGraph::GroupNode> groupNode0 = node0.dynamicCast<SceneGraph::GroupNode>()) 
    {
      if (Ref<SceneGraph::GroupNode> groupNode1 = node1.dynamicCast<SceneGraph::GroupNode>()) 
      {
        if (groupNode0->children.size() != groupNode1->children.size()) 
          THROW_RUNTIME_ERROR("incompatible scene graph");

        for (size_t i=0; i<groupNode0->children.size(); i++) 
          extend_animation(groupNode0->children[i],groupNode1->children[i]);
      } 
      else THROW_RUNTIME_ERROR("incompatible scene graph"); 
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh0 = node0.dynamicCast<SceneGraph::TriangleMeshNode>()) 
    {
      if (Ref<SceneGraph::TriangleMeshNode> mesh1 = node1.dynamicCast<SceneGraph::TriangleMeshNode>())
      {
        if (mesh0->numVertices() != mesh1->numVertices())
          THROW_RUNTIME_ERROR("incompatible scene graph");

        for (auto& p : mesh1->positions)
          mesh0->positions.push_back(std::move(p));
      } 
      else THROW_RUNTIME_ERROR("incompatible scene graph"); 
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh0 = node0.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      if (Ref<SceneGraph::QuadMeshNode> mesh1 = node1.dynamicCast<SceneGraph::QuadMeshNode>())
      {
        if (mesh0->numVertices() != mesh1->numVertices())
          THROW_RUNTIME_ERROR("incompatible scene graph");

        for (auto& p : mesh1->positions)
          mesh0->positions.push_back(std::move(p));
      } 
      else THROW_RUNTIME_ERROR("incompatible scene graph"); 
    }
    else if (Ref<SceneGraph::HairSetNode> mesh0 = node0.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      if (Ref<SceneGraph::HairSetNode> mesh1 = node1.dynamicCast<SceneGraph::HairSetNode>()) 
      {
        if (mesh0->numVertices() != mesh1->numVertices())
          THROW_RUNTIME_ERROR("incompatible scene graph");

        for (auto& p : mesh1->positions)
          mesh0->positions.push_back(std::move(p));
      }
      else THROW_RUNTIME_ERROR("incompatible scene graph"); 
    }
    else if (Ref<SceneGraph::PointSetNode> mesh0 = node0.dynamicCast<SceneGraph::PointSetNode>())
    {
      if (Ref<SceneGraph::PointSetNode> mesh1 = node1.dynamicCast<SceneGraph::PointSetNode>())
      {
        if (mesh0->numVertices() != mesh1->numVertices())
          THROW_RUNTIME_ERROR("incompatible scene graph");

        for (auto& p : mesh1->positions)
          mesh0->positions.push_back(std::move(p));
      }
      else THROW_RUNTIME_ERROR("incompatible scene graph");
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh0 = node0.dynamicCast<SceneGraph::SubdivMeshNode>())
    {
      if (Ref<SceneGraph::SubdivMeshNode> mesh1 = node1.dynamicCast<SceneGraph::SubdivMeshNode>())
      {
        if (mesh0->numPositions() != mesh1->numPositions())
          THROW_RUNTIME_ERROR("incompatible scene graph");
        if (mesh0->verticesPerFace != mesh1->verticesPerFace)
          THROW_RUNTIME_ERROR("incompatible scene graph");

        for (auto& p : mesh1->positions)
          mesh0->positions.push_back(std::move(p));
      }
      else THROW_RUNTIME_ERROR("incompatible scene graph"); 
    }
  }